

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O3

IsMineResult
wallet::anon_unknown_1::IsMineInner
          (LegacyDataSPKM *keystore,CScript *scriptPubKey,IsMineSigVersion sigversion,
          bool recurse_scripthash)

{
  long *plVar1;
  pointer pbVar2;
  pointer puVar3;
  uchar *data;
  char cVar4;
  bool bVar5;
  TxoutType TVar6;
  int iVar7;
  IsMineResult IVar8;
  uint uVar9;
  CScript *pCVar10;
  long lVar11;
  CRIPEMD160 *this;
  anon_unknown_1 *paVar12;
  IsMineResult IVar13;
  long in_FS_OFFSET;
  span<const_std::byte,_18446744073709551615UL> b;
  span<const_std::byte,_18446744073709551615UL> b_00;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  vSolutions;
  uint160 result;
  CScriptID scriptID;
  CKeyID keyID;
  CPubKey pubkey;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_118;
  char *local_f8;
  long lStack_f0;
  undefined4 local_e8;
  direct_or_indirect local_d8;
  uint local_bc;
  char *local_b8;
  long lStack_b0;
  undefined4 local_a8;
  _Variadic_union<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  local_98;
  undefined1 local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_118.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_118.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_118.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  TVar6 = Solver(scriptPubKey,&local_118);
  local_b8 = (char *)0x0;
  lStack_b0 = 0;
  local_a8 = 0;
  switch(TVar6) {
  case PUBKEY:
    CPubKey::Set<unsigned_char_const*>
              ((CPubKey *)&local_98._M_first,
               ((local_118.
                 super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start,
               ((local_118.
                 super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish);
    CPubKey::GetID((CKeyID *)&local_d8.indirect_contents,(CPubKey *)&local_98._M_first);
    local_a8 = local_d8._16_4_;
    local_b8 = local_d8.indirect_contents.indirect;
    lStack_b0 = local_d8._8_8_;
    if ((P2SH < sigversion) &&
       (IVar13 = INVALID,
       (long)((local_118.
               super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_finish -
       (long)((local_118.
               super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start != 0x21)) goto LAB_00210c59;
    iVar7 = (*(keystore->super_ScriptPubKeyMan)._vptr_ScriptPubKeyMan[0x1d])(keystore,&local_b8);
    cVar4 = (char)iVar7;
    goto LAB_00210a29;
  case PUBKEYHASH:
    plVar1 = (long *)((local_118.
                       super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                     super__Vector_impl_data._M_start;
    if ((long)((local_118.
                super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_finish - (long)plVar1 != 0x14) goto LAB_00210ca0;
    local_b8 = (char *)*plVar1;
    lStack_b0 = plVar1[1];
    local_a8 = (undefined4)plVar1[2];
    if (P2SH < sigversion) {
      local_98._M_first._M_storage._M_storage[0] = 0xff;
      iVar7 = (*(keystore->super_ScriptPubKeyMan)._vptr_ScriptPubKeyMan[0x1f])(keystore,&local_b8);
      if (((char)iVar7 != '\0') && ((local_98._M_first._M_storage._M_storage[0] & 0xfe) != 2)) {
LAB_00210c98:
        IVar13 = INVALID;
        goto LAB_00210c59;
      }
    }
    iVar7 = (*(keystore->super_ScriptPubKeyMan)._vptr_ScriptPubKeyMan[0x1d])(keystore,&local_b8);
    cVar4 = (char)iVar7;
LAB_00210a29:
    IVar13 = SPENDABLE;
    if (cVar4 != '\0') goto LAB_00210c59;
    break;
  case SCRIPTHASH:
    IVar13 = INVALID;
    if (sigversion != TOP) goto LAB_00210c59;
    plVar1 = (long *)((local_118.
                       super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                     super__Vector_impl_data._M_start;
    if ((long)((local_118.
                super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_finish - (long)plVar1 != 0x14) goto LAB_00210ca0;
    local_d8.indirect_contents.indirect = (char *)*plVar1;
    local_d8._8_8_ = plVar1[1];
    local_d8._16_4_ = (undefined4)plVar1[2];
    local_98._16_8_ = 0;
    local_98._24_8_ = 0;
    local_98._0_8_ = (anon_unknown_1 *)0x0;
    local_98._8_8_ =
         (vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          *)0x0;
    uVar9 = (*(keystore->super_FillableSigningProvider).super_SigningProvider._vptr_SigningProvider
              [2])(&keystore->super_FillableSigningProvider);
    if ((recurse_scripthash & (byte)uVar9) != 1) goto LAB_00210c27;
    IVar8 = IsMineInner(keystore,(CScript *)&local_98._M_first,P2SH,true);
LAB_00210c1c:
    IVar13 = NO;
    if (0 < (int)IVar8) {
      IVar13 = IVar8;
    }
    goto LAB_00210c2e;
  case MULTISIG:
    if (sigversion != TOP) {
      std::
      vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
      ::
      vector<__gnu_cxx::__normal_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>*,std::vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,void>
                ((vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  *)&local_98._M_first,
                 local_118.
                 super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 1,
                 local_118.
                 super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -1,
                 (allocator_type *)&local_d8.indirect_contents);
      if (local_98._8_8_ - local_98._0_8_ != 0 && sigversion != P2SH) {
        lVar11 = ((long)(local_98._8_8_ - local_98._0_8_) >> 3) * -0x5555555555555555;
        lVar11 = lVar11 + (ulong)(lVar11 == 0);
        paVar12 = (anon_unknown_1 *)(local_98._0_8_ + 8);
        do {
          if (*(long *)paVar12 - *(long *)(paVar12 + -8) != 0x21) {
            std::
            vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::~vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       *)&local_98._M_first);
            goto LAB_00210c98;
          }
          paVar12 = paVar12 + 0x18;
          lVar11 = lVar11 + -1;
        } while (lVar11 != 0);
      }
      bVar5 = HaveKeys((anon_unknown_1 *)local_98._0_8_,
                       (vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        *)local_98._8_8_,keystore);
      std::
      vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::~vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 *)&local_98._M_first);
      IVar13 = SPENDABLE;
      if (bVar5) goto LAB_00210c59;
    }
    break;
  case WITNESS_V0_SCRIPTHASH:
    IVar13 = INVALID;
    if (sigversion == WITNESS_V0) goto LAB_00210c59;
    if (sigversion == TOP) {
      local_98._16_8_ = 0;
      local_98._24_8_ = 0;
      local_98._0_8_ = (anon_unknown_1 *)0x0;
      local_98._8_8_ =
           (vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            *)0x0;
      local_f8 = (char *)((ulong)local_f8._1_7_ << 8);
      prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
                ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_98._M_first,
                 (iterator)&local_98,(uchar *)&local_f8);
      pbVar2 = ((local_118.
                 super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      b_00._M_extent._M_extent_value =
           (long)((local_118.
                   super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                 super__Vector_impl_data._M_finish - (long)pbVar2;
      b_00._M_ptr = pbVar2;
      pCVar10 = CScript::operator<<((CScript *)&local_98._M_first,b_00);
      CScriptID::CScriptID((CScriptID *)&local_d8.indirect_contents,pCVar10);
      iVar7 = (*(keystore->super_FillableSigningProvider).super_SigningProvider.
                _vptr_SigningProvider[3])(&keystore->super_FillableSigningProvider,&local_d8);
      if (0x1c < (uint)local_98._28_4_) {
        free((void *)local_98._0_8_);
      }
      if ((char)iVar7 == '\0') break;
    }
    data = ((local_118.
             super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
    puVar3 = ((local_118.
               super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    local_f8 = (char *)0x0;
    lStack_f0 = 0;
    local_e8 = 0;
    CRIPEMD160::CRIPEMD160((CRIPEMD160 *)&local_98._M_first);
    this = CRIPEMD160::Write((CRIPEMD160 *)&local_98._M_first,data,(long)puVar3 - (long)data);
    CRIPEMD160::Finalize(this,(uchar *)&local_f8);
    local_d8.indirect_contents.indirect = local_f8;
    local_d8._8_8_ = lStack_f0;
    local_d8._16_4_ = local_e8;
    local_98._16_8_ = 0;
    local_98._24_8_ = 0;
    local_98._0_8_ = (anon_unknown_1 *)0x0;
    local_98._8_8_ =
         (vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          *)0x0;
    uVar9 = (*(keystore->super_FillableSigningProvider).super_SigningProvider._vptr_SigningProvider
              [2])(&keystore->super_FillableSigningProvider);
    if ((recurse_scripthash & (byte)uVar9) == 1) {
      IVar8 = IsMineInner(keystore,(CScript *)&local_98._M_first,WITNESS_V0,true);
      goto LAB_00210c1c;
    }
LAB_00210c27:
    IVar13 = (uVar9 & 0xff) * 2;
LAB_00210c2e:
    if (0x1c < (uint)local_98._28_4_) {
      free((void *)local_98._0_8_);
    }
LAB_00210c45:
    if (IVar13 != NO) goto LAB_00210c59;
    break;
  case WITNESS_V0_KEYHASH:
    IVar13 = INVALID;
    if (sigversion == WITNESS_V0) goto LAB_00210c59;
    if (sigversion == TOP) {
      local_98._16_8_ = 0;
      local_98._24_8_ = 0;
      local_98._0_8_ = (anon_unknown_1 *)0x0;
      local_98._8_8_ =
           (vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            *)0x0;
      local_f8 = (char *)((ulong)local_f8._1_7_ << 8);
      prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
                ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_98._M_first,
                 (iterator)&local_98,(uchar *)&local_f8);
      pbVar2 = ((local_118.
                 super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      b._M_extent._M_extent_value =
           (long)((local_118.
                   super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                 super__Vector_impl_data._M_finish - (long)pbVar2;
      b._M_ptr = pbVar2;
      pCVar10 = CScript::operator<<((CScript *)&local_98._M_first,b);
      CScriptID::CScriptID((CScriptID *)&local_d8.indirect_contents,pCVar10);
      iVar7 = (*(keystore->super_FillableSigningProvider).super_SigningProvider.
                _vptr_SigningProvider[3])(&keystore->super_FillableSigningProvider,&local_d8);
      if (0x1c < (uint)local_98._28_4_) {
        free((void *)local_98._0_8_);
      }
      if ((char)iVar7 == '\0') break;
    }
    puVar3 = ((local_118.
               super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((long)((local_118.
                super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_finish - (long)puVar3 != 0x14) {
LAB_00210ca0:
      __assert_fail("vch.size() == WIDTH",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/uint256.h"
                    ,0x2a,"base_blob<160>::base_blob(Span<const unsigned char>) [BITS = 160]");
    }
    local_98._0_8_ = *(undefined8 *)puVar3;
    local_98._8_8_ = *(undefined8 *)(puVar3 + 8);
    local_98._16_4_ = *(undefined4 *)(puVar3 + 0x10);
    local_50 = 2;
    GetScriptForDestination
              ((CScript *)&local_d8.indirect_contents,(CTxDestination *)&local_98._M_first);
    IVar8 = IsMineInner(keystore,(CScript *)&local_d8.indirect_contents,WITNESS_V0,true);
    IVar13 = NO;
    if (0 < (int)IVar8) {
      IVar13 = IVar8;
    }
    if (0x1c < local_bc) {
      free(local_d8.indirect_contents.indirect);
      local_d8.indirect_contents.indirect = (char *)0x0;
    }
    std::__detail::__variant::
    _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
    ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                         *)&local_98._M_first);
    goto LAB_00210c45;
  }
  bVar5 = LegacyDataSPKM::HaveWatchOnly(keystore,scriptPubKey);
  IVar13 = (IsMineResult)bVar5;
LAB_00210c59:
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::~vector(&local_118);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return IVar13;
  }
  __stack_chk_fail();
}

Assistant:

IsMineResult IsMineInner(const LegacyDataSPKM& keystore, const CScript& scriptPubKey, IsMineSigVersion sigversion, bool recurse_scripthash=true)
{
    IsMineResult ret = IsMineResult::NO;

    std::vector<valtype> vSolutions;
    TxoutType whichType = Solver(scriptPubKey, vSolutions);

    CKeyID keyID;
    switch (whichType) {
    case TxoutType::NONSTANDARD:
    case TxoutType::NULL_DATA:
    case TxoutType::WITNESS_UNKNOWN:
    case TxoutType::WITNESS_V1_TAPROOT:
    case TxoutType::ANCHOR:
        break;
    case TxoutType::PUBKEY:
        keyID = CPubKey(vSolutions[0]).GetID();
        if (!PermitsUncompressed(sigversion) && vSolutions[0].size() != 33) {
            return IsMineResult::INVALID;
        }
        if (keystore.HaveKey(keyID)) {
            ret = std::max(ret, IsMineResult::SPENDABLE);
        }
        break;
    case TxoutType::WITNESS_V0_KEYHASH:
    {
        if (sigversion == IsMineSigVersion::WITNESS_V0) {
            // P2WPKH inside P2WSH is invalid.
            return IsMineResult::INVALID;
        }
        if (sigversion == IsMineSigVersion::TOP && !keystore.HaveCScript(CScriptID(CScript() << OP_0 << vSolutions[0]))) {
            // We do not support bare witness outputs unless the P2SH version of it would be
            // acceptable as well. This protects against matching before segwit activates.
            // This also applies to the P2WSH case.
            break;
        }
        ret = std::max(ret, IsMineInner(keystore, GetScriptForDestination(PKHash(uint160(vSolutions[0]))), IsMineSigVersion::WITNESS_V0));
        break;
    }
    case TxoutType::PUBKEYHASH:
        keyID = CKeyID(uint160(vSolutions[0]));
        if (!PermitsUncompressed(sigversion)) {
            CPubKey pubkey;
            if (keystore.GetPubKey(keyID, pubkey) && !pubkey.IsCompressed()) {
                return IsMineResult::INVALID;
            }
        }
        if (keystore.HaveKey(keyID)) {
            ret = std::max(ret, IsMineResult::SPENDABLE);
        }
        break;
    case TxoutType::SCRIPTHASH:
    {
        if (sigversion != IsMineSigVersion::TOP) {
            // P2SH inside P2WSH or P2SH is invalid.
            return IsMineResult::INVALID;
        }
        CScriptID scriptID = CScriptID(uint160(vSolutions[0]));
        CScript subscript;
        if (keystore.GetCScript(scriptID, subscript)) {
            ret = std::max(ret, recurse_scripthash ? IsMineInner(keystore, subscript, IsMineSigVersion::P2SH) : IsMineResult::SPENDABLE);
        }
        break;
    }
    case TxoutType::WITNESS_V0_SCRIPTHASH:
    {
        if (sigversion == IsMineSigVersion::WITNESS_V0) {
            // P2WSH inside P2WSH is invalid.
            return IsMineResult::INVALID;
        }
        if (sigversion == IsMineSigVersion::TOP && !keystore.HaveCScript(CScriptID(CScript() << OP_0 << vSolutions[0]))) {
            break;
        }
        CScriptID scriptID{RIPEMD160(vSolutions[0])};
        CScript subscript;
        if (keystore.GetCScript(scriptID, subscript)) {
            ret = std::max(ret, recurse_scripthash ? IsMineInner(keystore, subscript, IsMineSigVersion::WITNESS_V0) : IsMineResult::SPENDABLE);
        }
        break;
    }

    case TxoutType::MULTISIG:
    {
        // Never treat bare multisig outputs as ours (they can still be made watchonly-though)
        if (sigversion == IsMineSigVersion::TOP) {
            break;
        }

        // Only consider transactions "mine" if we own ALL the
        // keys involved. Multi-signature transactions that are
        // partially owned (somebody else has a key that can spend
        // them) enable spend-out-from-under-you attacks, especially
        // in shared-wallet situations.
        std::vector<valtype> keys(vSolutions.begin()+1, vSolutions.begin()+vSolutions.size()-1);
        if (!PermitsUncompressed(sigversion)) {
            for (size_t i = 0; i < keys.size(); i++) {
                if (keys[i].size() != 33) {
                    return IsMineResult::INVALID;
                }
            }
        }
        if (HaveKeys(keys, keystore)) {
            ret = std::max(ret, IsMineResult::SPENDABLE);
        }
        break;
    }
    } // no default case, so the compiler can warn about missing cases

    if (ret == IsMineResult::NO && keystore.HaveWatchOnly(scriptPubKey)) {
        ret = std::max(ret, IsMineResult::WATCH_ONLY);
    }
    return ret;
}